

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::_::concat<kj::StringPtr,kj::StringPtr&,kj::StringPtr>
          (String *__return_storage_ptr__,_ *this,StringPtr *params,StringPtr *params_1,
          StringPtr *params_2)

{
  void *__src;
  long lVar1;
  char *pcVar2;
  size_t sVar3;
  char *__dest;
  
  heapString(__return_storage_ptr__,
             ((params_1->content).size_ + (params->content).size_ + *(long *)(this + 8)) - 3);
  __dest = (char *)(__return_storage_ptr__->content).size_;
  if (__dest != (char *)0x0) {
    __dest = (__return_storage_ptr__->content).ptr;
  }
  __src = *(void **)this;
  lVar1 = *(long *)(this + 8);
  if (__src != (void *)((long)__src + lVar1 + -1)) {
    memcpy(__dest,__src,lVar1 - 1);
    __dest = __dest + lVar1 + -1;
  }
  pcVar2 = (params->content).ptr;
  sVar3 = (params->content).size_;
  if (pcVar2 != pcVar2 + (sVar3 - 1)) {
    memcpy(__dest,pcVar2,sVar3 - 1);
    __dest = __dest + (sVar3 - 1);
  }
  pcVar2 = (params_1->content).ptr;
  sVar3 = (params_1->content).size_;
  if (pcVar2 != pcVar2 + (sVar3 - 1)) {
    memcpy(__dest,pcVar2,sVar3 - 1);
  }
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}